

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::checkConfiguration(QPDFJob *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *pcVar2;
  long lVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  const_iterator cVar8;
  undefined8 extraout_RAX;
  element_type *peVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R15;
  string local_78;
  key_type local_58;
  
  peVar9 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar9->replace_input == true) {
    if ((peVar9->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) goto LAB_00171a2a;
    if (peVar9->split_pages != 0) goto LAB_00171a51;
    if (peVar9->json_version == 0) goto LAB_00171698;
LAB_00171a78:
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"--json may not be used with --replace-input","");
    usage(&local_78);
LAB_00171a9f:
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"--replace-input may not be used with --empty","");
    usage(&local_78);
LAB_00171ac6:
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"an output file name is required; use - for standard output","");
    usage(&local_78);
LAB_00171aed:
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "--requires-password and --is-encrypted may not be given together","");
    usage(&local_78);
LAB_00171b14:
    local_78._M_dataplus._M_p = (pointer)unaff_R15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "json keys \"objects\" and \"objectinfo\" are only valid for json version 1","");
    usage(&local_78);
  }
  else {
LAB_00171698:
    peVar9 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar9->json_version != 0) &&
       ((peVar9->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0)) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-","");
      QUtil::make_shared_cstr((QUtil *)&local_58,&local_78);
      sVar5 = local_58._M_string_length;
      _Var4._M_p = local_58._M_dataplus._M_p;
      peVar9 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      this_00 = (peVar9->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (peVar9->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = _Var4._M_p
      ;
      (peVar9->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    peVar9 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar2 = (peVar9->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pcVar2 == (char *)0x0) {
LAB_001719dc:
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"an input file name is required","");
      usage(&local_78);
LAB_00171a03:
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"no output file may be given for this option","");
      usage(&local_78);
LAB_00171a2a:
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,
                 "--replace-input may not be used when an output file is specified","");
      usage(&local_78);
LAB_00171a51:
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"--split-pages may not be used with --replace-input","");
      usage(&local_78);
      goto LAB_00171a78;
    }
    bVar6 = peVar9->replace_input;
    if ((bVar6 == true) && (*pcVar2 == '\0')) goto LAB_00171a9f;
    if (peVar9->require_outfile == true) {
      if ((peVar9->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 || bVar6 != false) goto LAB_0017178c;
      goto LAB_00171ac6;
    }
    if (((peVar9->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) || (bVar6 != false)) goto LAB_00171a03;
LAB_0017178c:
    peVar9 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar9->check_requires_password == true) && (peVar9->check_is_encrypted == true))
    goto LAB_00171aed;
    peVar9 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((((peVar9->encrypt == true) && (peVar9->allow_insecure == false)) &&
        ((peVar9->owner_password)._M_string_length == 0)) &&
       (((peVar9->user_password)._M_string_length != 0 && (peVar9->keylen == 0x100))))
    goto LAB_00171b5c;
    peVar9 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar9->require_outfile == true) &&
       ((pcVar2 = (peVar9->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        pcVar2 != (char *)0x0 && (iVar7 = strcmp(pcVar2,"-"), iVar7 == 0)))) {
      bVar6 = true;
      if (peVar9->split_pages != 0) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,
                   "--split-pages may not be used when writing to standard output","");
        usage(&local_78);
        goto LAB_001719dc;
      }
    }
    else {
      bVar6 = false;
    }
    peVar9 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((bVar6) || ((peVar9->attachment_to_show)._M_string_length != 0)) {
      QPDFLogger::saveToStandardOutput
                ((peVar9->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 true);
    }
    peVar9 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar9->split_pages != 0) ||
       (bVar6 = QUtil::same_file((peVar9->infilename).
                                 super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                 (peVar9->outfilename).
                                 super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
       !bVar6)) {
      peVar9 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar9->json_version == 1) {
        paVar1 = &local_78.field_2;
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"qpdf","");
        this = (QPDFJob *)
               std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(peVar9->json_keys)._M_t,&local_78);
        peVar9 = (element_type *)&(peVar9->json_keys)._M_t._M_impl.super__Rb_tree_header;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)this == peVar9) {
          return;
        }
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"json key \"qpdf\" is only valid for json version > 1","");
        usage(&local_78);
      }
      unaff_R15 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)unaff_R15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"objectinfo","");
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(peVar9->json_keys)._M_t,&local_78);
      bVar6 = true;
      if ((_Rb_tree_header *)cVar8._M_node ==
          &(peVar9->json_keys)._M_t._M_impl.super__Rb_tree_header) {
        lVar3 = *(long *)this;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"objects","");
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(lVar3 + 0x290),&local_58);
        bVar6 = cVar8._M_node != (_Base_ptr)(lVar3 + 0x298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != unaff_R15) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (!bVar6) {
        return;
      }
      goto LAB_00171b14;
    }
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "input file and output file are the same; use --replace-input to intentionally overwrite the input file"
             ,"");
  usage(&local_78);
LAB_00171b5c:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "A PDF with a non-empty user password and an empty owner password encrypted with a 256-bit key is insecure as it can be opened without a password. If you really want to do this, you must also give the --allow-insecure option before the -- that follows --encrypt."
             ,"");
  usage(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
QPDFJob::checkConfiguration()
{
    // Do final checks for command-line consistency. (I always think this is called doFinalChecks,
    // so I'm putting that in a comment.)

    if (m->replace_input) {
        // Check for --empty appears later after we have checked m->infilename.
        if (m->outfilename) {
            usage("--replace-input may not be used when an output file is specified");
        } else if (m->split_pages) {
            usage("--split-pages may not be used with --replace-input");
        } else if (m->json_version) {
            usage("--json may not be used with --replace-input");
        }
    }
    if (m->json_version && (m->outfilename == nullptr)) {
        // The output file is optional with --json for backward compatibility and defaults to
        // standard output.
        m->outfilename = QUtil::make_shared_cstr("-");
    }
    if (m->infilename == nullptr) {
        usage("an input file name is required");
    } else if (m->replace_input && (strlen(m->infilename.get()) == 0)) {
        usage("--replace-input may not be used with --empty");
    } else if (m->require_outfile && (m->outfilename == nullptr) && (!m->replace_input)) {
        usage("an output file name is required; use - for standard output");
    } else if ((!m->require_outfile) && ((m->outfilename != nullptr) || m->replace_input)) {
        usage("no output file may be given for this option");
    }
    if (m->check_requires_password && m->check_is_encrypted) {
        usage("--requires-password and --is-encrypted may not be given together");
    }

    if (m->encrypt && (!m->allow_insecure) &&
        (m->owner_password.empty() && (!m->user_password.empty()) && (m->keylen == 256))) {
        // Note that empty owner passwords for R < 5 are copied from the user password, so this lack
        // of security is not an issue for those files. Also we are consider only the ability to
        // open the file without a password to be insecure. We are not concerned about whether the
        // viewer enforces security settings when the user and owner password match.
        usage(
            "A PDF with a non-empty user password and an empty owner password encrypted with a "
            "256-bit key is insecure as it can be opened without a password. If you really want to"
            " do this, you must also give the --allow-insecure option before the -- that follows "
            "--encrypt.");
    }

    bool save_to_stdout = false;
    if (m->require_outfile && m->outfilename && (strcmp(m->outfilename.get(), "-") == 0)) {
        if (m->split_pages) {
            usage("--split-pages may not be used when writing to standard output");
        }
        save_to_stdout = true;
    }
    if (!m->attachment_to_show.empty()) {
        save_to_stdout = true;
    }
    if (save_to_stdout) {
        m->log->saveToStandardOutput(true);
    }
    if ((!m->split_pages) && QUtil::same_file(m->infilename.get(), m->outfilename.get())) {
        QTC::TC("qpdf", "QPDFJob same file error");
        usage(
            "input file and output file are the same; use --replace-input to intentionally "
            "overwrite the input file");
    }

    if (m->json_version == 1) {
        if (m->json_keys.count("qpdf")) {
            usage("json key \"qpdf\" is only valid for json version > 1");
        }
    } else {
        if (m->json_keys.count("objectinfo") || m->json_keys.count("objects")) {
            usage("json keys \"objects\" and \"objectinfo\" are only valid for json version 1");
        }
    }
}